

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

size_t __thiscall
google::protobuf::compiler::CodeGeneratorResponse::ByteSizeLong(CodeGeneratorResponse *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  anon_union_56_1_493b367e_for_CodeGeneratorResponse_11 aVar4;
  uint uVar5;
  Rep *pRVar6;
  size_t sVar7;
  ulong uVar8;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *this_00;
  CachedSize *pCVar9;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *pRVar10;
  
  pCVar9 = (CachedSize *)(long)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.file_;
  pRVar10 = this_00;
  if ((undefined1  [56])((undefined1  [56])this->field_0 & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0) {
    pRVar6 = protobuf::internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar10 = (RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *)
              pRVar6->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar6 = protobuf::internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *)
                pRVar6->elements;
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar10 !=
         (RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar10 = (RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *)
                &(pRVar10->super_RepeatedPtrFieldBase).current_size_) {
    sVar7 = CodeGeneratorResponse_File::ByteSizeLong
                      ((CodeGeneratorResponse_File *)
                       (pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar5 = (uint)sVar7 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    pCVar9 = (CachedSize *)((long)&pCVar9->atom_ + (iVar3 * 9 + 0x49U >> 6) + sVar7);
  }
  aVar4 = this->field_0;
  if (((undefined1  [56])aVar4 & (undefined1  [56])0xf) != (undefined1  [56])0x0) {
    if (((undefined1  [56])aVar4 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.error_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                       + 8);
      uVar5 = (uint)lVar2 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      pCVar9 = (CachedSize *)((long)&pCVar9->atom_ + (ulong)(iVar1 * 9 + 0x49U >> 6) + lVar2 + 1);
    }
    if (((undefined1  [56])aVar4 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      uVar8 = (this->field_0)._impl_.supported_features_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      pCVar9 = (CachedSize *)((long)&pCVar9->atom_ + (ulong)((int)lVar2 * 9 + 0x89U >> 6));
    }
    if (((undefined1  [56])aVar4 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      uVar8 = (long)(this->field_0)._impl_.minimum_edition_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      pCVar9 = (CachedSize *)((long)&pCVar9->atom_ + (ulong)((int)lVar2 * 9 + 0x89U >> 6));
    }
    if (((undefined1  [56])aVar4 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
      uVar8 = (long)(this->field_0)._impl_.maximum_edition_ | 1;
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      pCVar9 = (CachedSize *)((long)&pCVar9->atom_ + (ulong)((int)lVar2 * 9 + 0x89U >> 6));
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize((ulong)this,pCVar9);
  return sVar7;
}

Assistant:

::size_t CodeGeneratorResponse::ByteSizeLong() const {
          const CodeGeneratorResponse& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorResponse)
          ::size_t total_size = 0;

          ::uint32_t cached_has_bits = 0;
          // Prevent compiler warnings about cached_has_bits being unused
          (void)cached_has_bits;

          ::_pbi::Prefetch5LinesFrom7Lines(&this_);
           {
            // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
            {
              total_size += 1UL * this_._internal_file_size();
              for (const auto& msg : this_._internal_file()) {
                total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
              }
            }
          }
          cached_has_bits = this_._impl_._has_bits_[0];
          if (cached_has_bits & 0x0000000fu) {
            // optional string error = 1;
            if (cached_has_bits & 0x00000001u) {
              total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                              this_._internal_error());
            }
            // optional uint64 supported_features = 2;
            if (cached_has_bits & 0x00000002u) {
              total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
                  this_._internal_supported_features());
            }
            // optional int32 minimum_edition = 3;
            if (cached_has_bits & 0x00000004u) {
              total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
                  this_._internal_minimum_edition());
            }
            // optional int32 maximum_edition = 4;
            if (cached_has_bits & 0x00000008u) {
              total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
                  this_._internal_maximum_edition());
            }
          }
          return this_.MaybeComputeUnknownFieldsSize(total_size,
                                                     &this_._impl_._cached_size_);
        }